

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayout::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QString *objectName)

{
  Data *pDVar1;
  long lVar2;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->docks;
  lVar2 = 0;
  do {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutInfo::indexOfPlaceHolder(__return_storage_ptr__,this_00,objectName);
    if ((__return_storage_ptr__->d).size != 0) {
      local_34 = (int)lVar2;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_34);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_003f5635;
    }
    pDVar1 = (__return_storage_ptr__->d).d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
      }
    }
    lVar2 = lVar2 + 1;
    this_00 = this_00 + 1;
  } while (lVar2 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_003f5635:
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayout::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QList<int> result = docks[i].indexOfPlaceHolder(objectName);
        if (!result.isEmpty()) {
            result.prepend(i);
            return result;
        }
    }
    return QList<int>();
}